

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O3

bool __thiscall
S2BooleanOperation::Impl::CrossingProcessor::ProcessEdge
          (CrossingProcessor *this,ShapeEdgeId a_id,CrossingIterator *it)

{
  int iVar1;
  bool bVar2;
  Edge a;
  Edge EStack_58;
  S2LogMessage local_28;
  
  (*this->a_shape_->_vptr_S2Shape[8])
            (&EStack_58,this->a_shape_,(ulong)(uint)this->chain_id_,
             (ulong)(uint)(a_id.edge_id - this->chain_start_));
  iVar1 = this->a_dimension_;
  if (iVar1 == 0) {
    bVar2 = ProcessEdge0(this,a_id,&EStack_58,it);
  }
  else if (iVar1 == 1) {
    bVar2 = ProcessEdge1(this,a_id,&EStack_58,it);
  }
  else {
    if (iVar1 != 2) {
      S2LogMessage::S2LogMessage
                (&local_28,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                 ,0x513,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_28.stream_,"Check failed: (2) == (a_dimension_) ",0x24);
      abort();
    }
    bVar2 = ProcessEdge2(this,a_id,&EStack_58,it);
  }
  return bVar2;
}

Assistant:

bool S2BooleanOperation::Impl::CrossingProcessor::ProcessEdge(
    ShapeEdgeId a_id, CrossingIterator* it) {
  // chain_edge() is faster than edge() when there are multiple chains.
  auto a = a_shape_->chain_edge(chain_id_, a_id.edge_id - chain_start_);
  if (a_dimension_ == 0) {
    return ProcessEdge0(a_id, a, it);
  } else if (a_dimension_ == 1) {
    return ProcessEdge1(a_id, a, it);
  } else {
    S2_DCHECK_EQ(2, a_dimension_);
    return ProcessEdge2(a_id, a, it);
  }
}